

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.h
# Opt level: O2

void __thiscall CFG::LoopShape::LoopShape(LoopShape *this)

{
  (this->super_Shape).Id = -1;
  (this->super_Shape).Next = (Shape *)0x0;
  (this->super_Shape).Type = Loop;
  (this->super_Shape)._vptr_Shape = (_func_int **)&PTR__LoopShape_00e224a8;
  this->Inner = (Shape *)0x0;
  ::wasm::InsertOrderedSet<CFG::Block_*>::InsertOrderedSet(&this->Entries);
  return;
}

Assistant:

LoopShape() : Shape(Loop) {}